

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderProgramResource.cpp
# Opt level: O3

bool __thiscall
glcts::GeometryShaderProgramResourceTest::checkIfResourceIsReferenced
          (GeometryShaderProgramResourceTest *this,GLuint program_object_id,GLenum interface,
          char *name)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar3;
  GLenum local_28;
  GLint params [1];
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  iVar1 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x9a8))(program_object_id,interface,name);
  if (iVar1 == -1) {
    bVar3 = false;
  }
  else {
    iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    local_28 = (this->super_TestCaseBase).m_glExtTokens.REFERENCED_BY_GEOMETRY_SHADER;
    params[0] = 0;
    (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x9c8))
              (this->m_program_object_id,interface,iVar1,1,&local_28,1,0,params);
    bVar3 = params[0] == 1;
  }
  return bVar3;
}

Assistant:

bool GeometryShaderProgramResourceTest::checkIfResourceIsReferenced(glw::GLuint program_object_id,
																	glw::GLenum interface, const char* name) const
{
	/* GL */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Resource index */
	glw::GLuint index = GL_INVALID_INDEX;

	/* Get resource's index by name */
	index = gl.getProgramResourceIndex(program_object_id, interface, name);

	/**
	 *     Otherwise, <name> is considered not to be the name
	 *     of an active resource, and INVALID_INDEX is returned.
	 **/
	if (GL_INVALID_INDEX == index)
	{
		return false;
	}

	/* Get property by index */
	return checkIfResourceAtIndexIsReferenced(program_object_id, interface, index);
}